

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O0

void xmlXPtrLocationSetRemove(xmlLocationSetPtr cur,int val)

{
  int local_14;
  int val_local;
  xmlLocationSetPtr cur_local;
  
  if ((cur != (xmlLocationSetPtr)0x0) && (val < cur->locNr)) {
    cur->locNr = cur->locNr + -1;
    for (local_14 = val; local_14 < cur->locNr; local_14 = local_14 + 1) {
      cur->locTab[local_14] = cur->locTab[local_14 + 1];
    }
    cur->locTab[cur->locNr] = (xmlXPathObjectPtr)0x0;
  }
  return;
}

Assistant:

void
xmlXPtrLocationSetRemove(xmlLocationSetPtr cur, int val) {
    if (cur == NULL) return;
    if (val >= cur->locNr) return;
    cur->locNr--;
    for (;val < cur->locNr;val++)
        cur->locTab[val] = cur->locTab[val + 1];
    cur->locTab[cur->locNr] = NULL;
}